

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<int>::test_all_algorithms(DivideTest<int> *this,int denom,set_t<int> *tested_denom)

{
  bool bVar1;
  iterator this_00;
  iterator __x;
  key_type_conflict1 *in_RDI;
  int in_stack_0000001c;
  undefined4 in_stack_00000020;
  int in_stack_00000024;
  DivideTest<int> *in_stack_00000028;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  
  this_00 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
  __x = std::set<int,_std::less<int>,_std::allocator<int>_>::find(in_stack_ffffffffffffffc8,in_RDI);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffe0,(_Self *)&stack0xffffffffffffffd8);
  if (bVar1) {
    test_many<(libdivide::Branching)0>(in_stack_00000028,in_stack_00000024);
    test_many<(libdivide::Branching)1>
              ((DivideTest<int> *)CONCAT44(in_stack_00000024,in_stack_00000020),in_stack_0000001c);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00._M_node,
               (value_type_conflict3 *)__x._M_node);
  }
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }